

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int testIO(char *filename)

{
  int iVar1;
  HPresolve *this;
  ostream *poVar2;
  HDual solver_1;
  HDual solver;
  int status;
  HPresolve *pre;
  HinOut h;
  HModel model;
  ostream *in_stack_fffffffffffd4ea0;
  HModel *in_stack_fffffffffffd4eb0;
  HModel aHStack_2b0f8 [8];
  HDual *in_stack_fffffffffffd4f10;
  HModel aHStack_165e8 [84775];
  allocator local_1ac1;
  string local_1ac0 [55];
  allocator local_1a89;
  string local_1a88 [32];
  HinOut local_1a68 [2248];
  HModel local_11a0 [1552];
  int local_b90;
  int local_4;
  
  HModel::HModel(local_11a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a88,"fileIO",&local_1a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ac0,"fileIO",&local_1ac1);
  HinOut::HinOut(local_1a68,local_1a88,local_1ac0);
  std::__cxx11::string::~string(local_1ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ac1);
  std::__cxx11::string::~string(local_1a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
  HinOut::HinOutTestRead(local_1a68,local_11a0);
  if (local_b90 == 0) {
    std::operator<<((ostream *)&std::cout,"Empty problem");
    local_4 = 1;
  }
  else {
    this = (HPresolve *)operator_new(0xb18);
    HPresolve::HPresolve(this);
    HModel::copy_fromHModelToHPresolve((HPresolve *)local_11a0);
    iVar1 = HPresolve::presolve();
    if (iVar1 == 0) {
      HModel::load_fromPresolve((HPresolve *)local_11a0);
      HDual::HDual(in_stack_fffffffffffd4f10);
      HDual::solve(aHStack_165e8,(int)local_11a0,0);
      HModel::getPrStatus(local_11a0);
      HPresolve::setProblemStatus((int)this);
      poVar2 = std::operator<<((ostream *)&std::cout," STATUS = ");
      iVar1 = HModel::getPrStatus(local_11a0);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      HModel::util_getPrimalDualValues
                ((vector *)local_11a0,(vector *)(this + 0xf0),(vector *)(this + 0x108),
                 (vector *)(this + 0x120));
      HModel::util_getBasicIndexNonbasicFlag((vector *)local_11a0,(vector *)(this + 600));
      HPresolve::postsolve();
      HModel::load_fromPostsolve((HPresolve *)local_11a0);
      HDual::solve(aHStack_165e8,(int)local_11a0,0);
      HModel::util_reportSolverOutcome((char *)local_11a0);
      HDual::~HDual(in_stack_fffffffffffd4f10);
    }
    else if (iVar1 == 3) {
      HPresolve::postsolve();
      HModel::load_fromPostsolve((HPresolve *)local_11a0);
      in_stack_fffffffffffd4eb0 = aHStack_2b0f8;
      HDual::HDual(in_stack_fffffffffffd4f10);
      HDual::solve(in_stack_fffffffffffd4eb0,(int)local_11a0,0);
      HModel::util_reportSolverOutcome((char *)local_11a0);
      HDual::~HDual(in_stack_fffffffffffd4f10);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Status return from presolve: ");
      in_stack_fffffffffffd4ea0 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::ostream::operator<<(in_stack_fffffffffffd4ea0,std::endl<char,std::char_traits<char>>);
    }
    if (this != (HPresolve *)0x0) {
      HPresolve::~HPresolve((HPresolve *)in_stack_fffffffffffd4ea0);
      operator_delete(this);
    }
    local_4 = 0;
  }
  HinOut::~HinOut((HinOut *)in_stack_fffffffffffd4ea0);
  HModel::~HModel(in_stack_fffffffffffd4eb0);
  return local_4;
}

Assistant:

int testIO(const char *filename) {
//testIO solve the problem in file with presolve

	HModel model;

	HinOut h("fileIO", "fileIO");
	h.HinOutTestRead(model);

	// Check size
	if (model.numRow == 0) {
		cout<<"Empty problem";
		return 1;
	}
	else if (1) {
		HPresolve * pre = new HPresolve();
		model.copy_fromHModelToHPresolve(pre);
		int status = pre->presolve();

		if (!status) {
			//pre->reportTimes();
			model.load_fromPresolve(pre);
			HDual solver;
			solver.solve(&model);
			pre->setProblemStatus(model.getPrStatus());
			cout<<" STATUS = " << model.getPrStatus() <<endl;
			model.util_getPrimalDualValues(pre->colValue, pre->colDual, pre->rowValue, pre->rowDual);
			model.util_getBasicIndexNonbasicFlag(pre->basicIndex, pre->nonbasicFlag);
			pre->postsolve();
			model.load_fromPostsolve(pre);
			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else if (status == HPresolve::Empty) {
			pre->postsolve();
			model.load_fromPostsolve(pre);
			HDual solver;

			solver.solve(&model);
			model.util_reportSolverOutcome("Postsolve");
		}
		else cout <<"Status return from presolve: "<< status<< endl;
		delete pre;
	}
	else {
	  HDual solver;
	  HPresolve * pre = new HPresolve();
	  model.copy_fromHModelToHPresolve(pre);
	  //pre->initializeVectors();
	  //pre->print(0);
	  model.initWithLogicalBasis();
	  solver.solve(&model);
	  model.util_reportSolverOutcome("testIO");
	}
	return 0;
}